

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O1

_Bool background_thread_pause_check(tsdn_t *tsdn,background_thread_info_t *info)

{
  background_thread_state_t bVar1;
  
  bVar1 = info->state;
  if (bVar1 == background_thread_paused) {
    background_thread_pause_check_cold_1();
  }
  return bVar1 == background_thread_paused;
}

Assistant:

static bool
background_thread_pause_check(tsdn_t *tsdn, background_thread_info_t *info) {
	if (unlikely(info->state == background_thread_paused)) {
		malloc_mutex_unlock(tsdn, &info->mtx);
		/* Wait on global lock to update status. */
		malloc_mutex_lock(tsdn, &background_thread_lock);
		malloc_mutex_unlock(tsdn, &background_thread_lock);
		malloc_mutex_lock(tsdn, &info->mtx);
		return true;
	}

	return false;
}